

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O0

void fixed_smul_cmb(pt_aff_t_conflict4 *out,uchar *scalar)

{
  uint64_t *in_RDI;
  uint64_t *unaff_retaddr;
  pt_aff_t_conflict4 lut;
  pt_prj_t_conflict4 R;
  pt_prj_t_conflict4 Q;
  int8_t rnaf [103];
  int is_neg;
  int diff;
  int d;
  int k;
  int j;
  int i;
  uint64_t *in_stack_000007d0;
  uint64_t *in_stack_000007d8;
  uint64_t *in_stack_000007e0;
  uchar *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  uint64_t local_408 [8];
  uint64_t *in_stack_fffffffffffffc38;
  uint64_t *in_stack_fffffffffffffc40;
  undefined1 auStack_3b8 [7];
  fiat_id_tc26_gost_3410_2012_512_paramSetC_uint1 in_stack_fffffffffffffc4f;
  uint64_t *in_stack_fffffffffffffc50;
  pt_prj_t_conflict4 *in_stack_fffffffffffffc88;
  pt_prj_t_conflict4 *in_stack_fffffffffffffc90;
  uint64_t auStack_368 [10];
  undefined1 local_318 [128];
  pt_prj_t_conflict4 *in_stack_fffffffffffffd68;
  pt_prj_t_conflict4 *in_stack_fffffffffffffd70;
  pt_aff_t_conflict4 *in_stack_fffffffffffffd80;
  pt_prj_t_conflict4 *in_stack_fffffffffffffd88;
  pt_prj_t_conflict4 *in_stack_fffffffffffffd90;
  undefined1 local_1d8 [80];
  undefined1 auStack_188 [80];
  undefined1 auStack_138 [80];
  undefined1 auStack_e8 [80];
  char local_98 [112];
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  
  local_28 = 0;
  memset(local_98,0,0x67);
  memset(local_1d8,0,0x140);
  memset(local_318,0,0x140);
  memset(local_408,0,0xf0);
  scalar_rwnaf((int8_t *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8);
  memset(local_1d8,0,0x50);
  memcpy(auStack_188,const_one,0x50);
  memset(auStack_138,0,0x50);
  memcpy(auStack_e8,const_one,0x50);
  for (local_14 = 0xe; -1 < local_14; local_14 = local_14 + -1) {
    for (local_18 = 0; local_14 != 0xe && local_18 < 5; local_18 = local_18 + 1) {
      point_double(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      if (local_18 * 0xf + local_14 < 0x67) {
        local_28 = (int)local_98[local_18 * 0xf + local_14] >> 0x1f & 1;
        local_20 = (int)(((int)local_98[local_18 * 0xf + local_14] ^ -local_28) + local_28 + -1) >>
                   1;
        for (local_1c = 0; (int)local_1c < 0x10; local_1c = local_1c + 1) {
          local_24 = 1U - ((int)-(local_20 ^ local_1c) >> 0x1f) & 1;
          fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
          fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
          fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
        }
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(in_RDI,local_408);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(in_RDI + 0x14,auStack_368);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
                   in_stack_fffffffffffffc38);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
                   in_stack_fffffffffffffc38);
        point_add_mixed(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffd80);
      }
    }
  }
  fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_408,(uint64_t *)lut_cmb);
  memcpy(auStack_3b8,lut_cmb[0][0].Y,0x50);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(auStack_368,lut_cmb[0][0].T);
  point_add_mixed(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4f,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc38);
  point_edwards2legacy(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(unaff_retaddr,in_RDI);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_000007e0,in_stack_000007d8,in_stack_000007d0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_000007e0,in_stack_000007d8,in_stack_000007d0);
  return;
}

Assistant:

static void fixed_smul_cmb(pt_aff_t *out, const unsigned char scalar[64]) {
    int i, j, k, d, diff, is_neg = 0;
    int8_t rnaf[103] = {0};
    pt_prj_t Q = {0}, R = {0};
    pt_aff_t lut = {0};

    scalar_rwnaf(rnaf, scalar);

    /* initalize accumulator to inf */
    fe_set_zero(Q.X);
    fe_copy(Q.Y, const_one);
    fe_set_zero(Q.Z);

#if defined(_MSC_VER)
    /* result still unsigned: yes we know */
#pragma warning(push)
#pragma warning(disable : 4146)
#endif

    for (i = 9; i >= 0; i--) {
        for (j = 0; i != 9 && j < RADIX; j++) point_double(&Q, &Q);
        for (j = 0; j < 12; j++) {
            if (j * 10 + i > 102) continue;
            d = rnaf[j * 10 + i];
            /* is_neg = (d < 0) ? 1 : 0 */
            is_neg = (d >> (8 * sizeof(int) - 1)) & 1;
            /* d = abs(d) */
            d = (d ^ -is_neg) + is_neg;
            d = (d - 1) >> 1;
            for (k = 0; k < DRADIX / 2; k++) {
                diff = (1 - (-(d ^ k) >> (8 * sizeof(int) - 1))) & 1;
                fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(
                    lut.X, diff, lut.X, lut_cmb[j][k].X);
                fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(
                    lut.Y, diff, lut.Y, lut_cmb[j][k].Y);
            }
            /* negate lut point if digit is negative */
            fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(out->Y, lut.Y);
            fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(lut.Y, is_neg,
                                                                lut.Y, out->Y);
            point_add_mixed(&Q, &Q, &lut);
        }
    }

#if defined(_MSC_VER)
#pragma warning(pop)
#endif

    /* conditionally subtract P if the scalar was even */
    fe_copy(lut.X, lut_cmb[0][0].X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(lut.Y, lut_cmb[0][0].Y);
    point_add_mixed(&R, &Q, &lut);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.X, scalar[0] & 1, R.X,
                                                        Q.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.Y, scalar[0] & 1, R.Y,
                                                        Q.Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.Z, scalar[0] & 1, R.Z,
                                                        Q.Z);

    /* convert to affine -- NB depends on coordinate system */
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(Q.Z, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out->X, Q.X, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out->Y, Q.Y, Q.Z);
}